

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O1

void setupMain(void)

{
  int iVar1;
  object *poVar2;
  object *poVar3;
  object *poVar4;
  object *poVar5;
  typeDesc *ptVar6;
  typeDesc *ptVar7;
  procFixStruct *ppVar8;
  procFixStruct *ppVar9;
  
  poVar5 = guard;
  poVar4 = topScope;
  poVar2 = topScope;
  do {
    poVar3 = poVar2;
    poVar2 = poVar3->next;
  } while (poVar2 != guard);
  poVar2 = (object *)calloc(1,0x90);
  poVar2->cl = 0x2c0;
  poVar2->next = poVar5;
  poVar3->next = poVar2;
  builtin_strncpy(poVar2->name,"main",5);
  iVar1 = intTypeIndex;
  poVar2->retTypeIndex = intTypeIndex;
  poVar2->hasPrototype = 1;
  poVar2->hasArguments = 1;
  poVar3 = (object *)calloc(1,0x90);
  poVar3->cl = 700;
  poVar3->dsc = poVar4;
  poVar3->next = poVar5;
  topScope = poVar3;
  poVar4 = (object *)calloc(1,0x90);
  builtin_strncpy(poVar4->name,"argc",5);
  poVar4->typeIndex = iVar1;
  poVar4->next = poVar5;
  poVar3->next = poVar4;
  poVar4->cl = 0x2c1;
  poVar4->val = 0x14;
  poVar4->lev = 1;
  poVar5 = (object *)calloc(1,0x90);
  builtin_strncpy(poVar5->name,"argv",5);
  ptVar6 = newType();
  ptVar6->form = 0x322;
  ptVar7 = getType(charTypeIndex);
  ptVar6->base = ptVar7;
  ptVar6->size = 0xc;
  poVar5->typeIndex = ptVar6->index;
  poVar5->cl = 0x2c5;
  poVar5->next = poVar4->next;
  poVar4->next = poVar5;
  poVar5->val = 8;
  poVar5->lev = 1;
  ppVar9 = procFixList;
  do {
    ppVar8 = ppVar9;
    ppVar9 = ppVar8->next;
  } while (ppVar9 != (procFixStruct *)0x0);
  ppVar9 = (procFixStruct *)calloc(1,0x18);
  ppVar9->pos = 5;
  ppVar9->proc = poVar2;
  ppVar8->next = ppVar9;
  ppVar9->next = (procFixStruct *)0x0;
  poVar2->dsc = topScope;
  topScope = topScope->dsc;
  return;
}

Assistant:

procedure
void setupMain(void) {
	variable struct object *proc; variable struct object *firstParam; 
	variable struct object *secondParam; variable struct object *it;
	variable struct typeDesc *tp; variable struct typeDesc *type;
	proc = newAnonymousObj(CLASS_PROC);
	stringCopy("main",proc->name);
	proc->retTypeIndex = intTypeIndex;
	proc->hasArguments = true;
	proc->hasPrototype = true;

	openScope();
	it = topScope;

	/* setup argc */
	allocMem(firstParam);
	stringCopy("argc", firstParam->name);
	firstParam->typeIndex = intTypeIndex;
	firstParam->next = it->next; it->next = firstParam;
	firstParam->cl = CLASS_VAR; /* value */
	firstParam->lev = 1; /* local */
	firstParam->val = 20;
	it = it->next;

	/* setup argv */
	allocMem(secondParam);
	stringCopy("argv", secondParam->name);
	tp = newType();
	tp->form = FORM_ARRAY;
	type = getType(charTypeIndex);
	tp->base = type;
	tp->size = wordSize + 8;
	secondParam->typeIndex = tp->index;
	secondParam->cl = CLASS_PAR; 
	secondParam->next = it->next; it->next = secondParam;
	secondParam->lev = 1;
	secondParam->val = 8;
	it = it->next;
	
	addProcToFixList(ENTRY,proc);

	/* set dsc to HEAD of inner scope */
	proc->dsc = topScope;
	closeScope();
	

}